

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswLcorr.c
# Opt level: O1

void Ssw_ManSweepTransfer(Ssw_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  
  pVVar3 = p->pAig->vCis;
  if (0 < pVVar3->nSize) {
    lVar4 = 0;
    do {
      pObj = (Aig_Obj_t *)pVVar3->pArray[lVar4];
      pAVar2 = p->pNodeToFrames[(long)pObj->Id * (long)p->nFrames];
      if (pAVar2 == (Aig_Obj_t *)((ulong)p->pFrames->pConst1 ^ 1)) {
        Ssw_SmlObjAssignConst(p->pSml,pObj,0,0);
      }
      else {
        if (((ulong)pAVar2 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObjFraig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswLcorr.c"
                        ,0x3c,"void Ssw_ManSweepTransfer(Ssw_Man_t *)");
        }
        if ((*(uint *)&pAVar2->field_0x18 & 7) != 2) {
          __assert_fail("Aig_ObjIsCi(pObjFraig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswLcorr.c"
                        ,0x3d,"void Ssw_ManSweepTransfer(Ssw_Man_t *)");
        }
        iVar1 = (pAVar2->field_0).CioId;
        if (((long)iVar1 < 0) || (p->vSimInfo->nSize <= iVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Ssw_SmlObjSetWord(p->pSml,pObj,*p->vSimInfo->pArray[iVar1],0,0);
      }
      lVar4 = lVar4 + 1;
      pVVar3 = p->pAig->vCis;
    } while (lVar4 < pVVar3->nSize);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Tranfers simulation information from FRAIG to AIG.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ssw_ManSweepTransfer( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjFraig;
    unsigned * pInfo;
    int i;
    // transfer simulation information
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pObjFraig = Ssw_ObjFrame( p, pObj, 0 );
        if ( pObjFraig == Aig_ManConst0(p->pFrames) )
        {
            Ssw_SmlObjAssignConst( p->pSml, pObj, 0, 0 );
            continue;
        }
        assert( !Aig_IsComplement(pObjFraig) );
        assert( Aig_ObjIsCi(pObjFraig) );
        pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObjFraig) );
        Ssw_SmlObjSetWord( p->pSml, pObj, pInfo[0], 0, 0 );
    }
}